

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

void no_label::parse_no_label
               (parser *param_1,shared_data *param_2,void *param_3,v_array<substring> *words)

{
  bool bVar1;
  ostream *poVar2;
  substring *psVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (words->_end != words->_begin) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Error: ",7);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," is too many tokens for a simple label: ",0x28);
    psVar3 = words->_begin;
    if (words->_end != psVar3) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        std::ostream::write((char *)&std::cout,(long)psVar3[uVar4].begin);
        psVar3 = words->_begin;
        bVar1 = uVar5 < (ulong)((long)words->_end - (long)psVar3 >> 4);
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar1);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

inline size_t size() const { return _end - _begin; }